

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall sznet::TimerQueue::addTimerInLoop(TimerQueue *this,Timer *timer)

{
  uint __line;
  char *__assertion;
  pair<std::_Rb_tree_iterator<std::pair<sznet::Timer_*,_long>_>,_bool> pVar1;
  pair<sznet::Timer_*,_long> local_30;
  
  net::EventLoop::assertInLoopThread(this->m_loop);
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (ulong)(this->m_timerMinHeap).m_size) {
    MinHeap<sznet::Timer>::push(&this->m_timerMinHeap,timer);
    local_30.second = timer->m_sequence;
    local_30.first = timer;
    pVar1 = std::
            _Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
            ::_M_insert_unique<std::pair<sznet::Timer*,long>>
                      ((_Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
                        *)&this->m_activeTimers,&local_30);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assertion = "result.second";
      __line = 0x49;
    }
    else {
      if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (ulong)(this->m_timerMinHeap).m_size) {
        return;
      }
      __assertion = "m_timerMinHeap.size() == m_activeTimers.size()";
      __line = 0x4a;
    }
  }
  else {
    __assertion = "m_timerMinHeap.size() == m_activeTimers.size()";
    __line = 0x46;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,__line,"void sznet::TimerQueue::addTimerInLoop(Timer *)");
}

Assistant:

void TimerQueue::addTimerInLoop(Timer* timer)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	m_timerMinHeap.push(timer);
	std::pair<ActiveTimerSet::iterator, bool> result = m_activeTimers.insert(ActiveTimer(timer, timer->sequence()));
	assert(result.second); (void)result;
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}